

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void ecs_run_monitor(ecs_world_t *world,ecs_matched_query_t *monitor,ecs_entities_t *components,
                    int32_t row,int32_t count,ecs_entity_t *entities)

{
  ecs_query_t *query_00;
  ecs_world_t *entity;
  undefined1 local_128 [8];
  ecs_iter_t it;
  EcsSystem *system_data;
  ecs_entity_t system;
  ecs_query_t *query;
  ecs_entity_t *entities_local;
  int32_t count_local;
  int32_t row_local;
  ecs_entities_t *components_local;
  ecs_matched_query_t *monitor_local;
  ecs_world_t *world_local;
  
  query_00 = monitor->query;
  _ecs_assert(query_00 != (ecs_query_t *)0x0,0xc,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x201);
  if (query_00 == (ecs_query_t *)0x0) {
    __assert_fail("query != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x201,
                  "void ecs_run_monitor(ecs_world_t *, ecs_matched_query_t *, ecs_entities_t *, int32_t, int32_t, ecs_entity_t *)"
                 );
  }
  entity = (ecs_world_t *)query_00->system;
  it.iter.parent.table.references = (ecs_ref_t *)ecs_get_w_entity(world,(ecs_entity_t)entity,5);
  _ecs_assert(it.iter.parent.table.references != (ecs_ref_t *)0x0,0xc,(char *)0x0,
              "system_data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0x205);
  if (it.iter.parent.table.references == (ecs_ref_t *)0x0) {
    __assert_fail("system_data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x205,
                  "void ecs_run_monitor(ecs_world_t *, ecs_matched_query_t *, ecs_entities_t *, int32_t, int32_t, ecs_entity_t *)"
                 );
  }
  if ((it.iter.parent.table.references)->entity != 0) {
    memset(local_128,0,0xe0);
    ecs_query_set_iter(world,query_00,(ecs_iter_t *)local_128,monitor->matched_table_index,row,count
                      );
    it.entities = (ecs_entity_t *)(it.iter.parent.table.references)->component;
    if (entities != (ecs_entity_t *)0x0) {
      it.table_columns = entities;
    }
    local_128 = (undefined1  [8])world;
    it.real_world = entity;
    it._112_8_ = components;
    (*(code *)(it.iter.parent.table.references)->entity)(local_128);
  }
  return;
}

Assistant:

void ecs_run_monitor(
    ecs_world_t *world,
    ecs_matched_query_t *monitor,
    ecs_entities_t *components,
    int32_t row,
    int32_t count,
    ecs_entity_t *entities)
{
    ecs_query_t *query = monitor->query;
    ecs_assert(query != NULL, ECS_INTERNAL_ERROR, NULL);

    ecs_entity_t system = query->system;
    const EcsSystem *system_data = ecs_get(world, system, EcsSystem);
    ecs_assert(system_data != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!system_data->action) {
        return;
    }

    ecs_iter_t it = {0};
    ecs_query_set_iter( world, query, &it, 
        monitor->matched_table_index, row, count);

    it.world = world;
    it.triggered_by = components;
    it.param = system_data->ctx;

    if (entities) {
        it.entities = entities;
    }

    it.system = system;
    system_data->action(&it);
}